

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  StringPtr *pSVar2;
  StringPtr *pSVar3;
  size_t sVar4;
  size_t in_RCX;
  StringPtr *in_R8;
  StringPtr *in_R9;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  ArrayPtr<kj::StringPtr> table;
  ArrayPtr<kj::StringPtr> table_00;
  char *local_38;
  size_t sStack_30;
  
  pSVar2 = (this->rows).builder.ptr + pos;
  local_38 = (pSVar2->content).ptr;
  sStack_30 = (pSVar2->content).size_;
  table.size_ = (size_t)&local_38;
  table.ptr = (StringPtr *)pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::erase<kj::StringPtr,kj::StringPtr>
            (&this->indexes,table,in_RCX,in_R8);
  pSVar2 = (this->rows).builder.ptr;
  table_00.ptr = (StringPtr *)(((long)(this->rows).builder.pos - (long)pSVar2 >> 4) - 1);
  if (table_00.ptr != (StringPtr *)pos) {
    pSVar2 = pSVar2 + (long)table_00.ptr;
    local_38 = (pSVar2->content).ptr;
    sStack_30 = (pSVar2->content).size_;
    table_00.size_ = pos;
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::move<kj::StringPtr,kj::StringPtr>
              (&this->indexes,table_00,(size_t)&local_38,(size_t)in_R8,in_R9);
    pSVar3 = (this->rows).builder.ptr;
    pSVar2 = pSVar3 + (long)table_00.ptr;
    sVar4 = (pSVar2->content).size_;
    pSVar3 = pSVar3 + pos;
    (pSVar3->content).ptr = (pSVar2->content).ptr;
    (pSVar3->content).size_ = sVar4;
  }
  ppRVar1 = &(this->rows).builder.pos;
  *ppRVar1 = *ppRVar1 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}